

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O0

void __thiscall Clause::Clause<Clause>(Clause *this,Clause *ps,bool learnt)

{
  uint uVar1;
  Lit LVar2;
  byte in_DL;
  Clause *in_RSI;
  Clause *in_RDI;
  uint i;
  Lit *local_28;
  uint local_18;
  
  local_28 = in_RDI->data;
  do {
    Lit::Lit(local_28);
    local_28 = local_28 + 1;
  } while ((Clause *)local_28 != in_RDI + 1);
  clearFlags(in_RDI);
  uVar1 = size(in_RSI);
  *(uint *)in_RDI = *(uint *)in_RDI & 0xff | uVar1 << 8;
  *(uint *)in_RDI = *(uint *)in_RDI & 0xfffffffe | (uint)(in_DL & 1);
  local_18 = 0;
  while( true ) {
    uVar1 = size(in_RSI);
    if (uVar1 <= local_18) break;
    LVar2 = operator[](in_RSI,local_18);
    in_RDI->data[local_18].x = LVar2.x;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

Clause(const V& ps, bool learnt) {
		assert(ps.size() < (1 << 24));
		clearFlags();
		sz = static_cast<unsigned int>(ps.size());
		this->learnt = learnt;
		for (unsigned int i = 0; i < ps.size(); i++) {
			data[i] = ps[i];
		}
	}